

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void __thiscall
Centaurus::DFARoutineEM64T<char>::DFARoutineEM64T
          (DFARoutineEM64T<char> *this,DFA<char> *dfa,Logger *logger)

{
  CodeHolder *this_00;
  Label rejectlabel;
  X86Assembler as;
  MyConstPool pool;
  anon_union_16_7_ed616b9d_for_Operand__0 local_208;
  X86Assembler local_1f8;
  MyConstPool local_140;
  
  this->_vptr_DFARoutineEM64T = (_func_int **)&PTR__DFARoutineEM64T_001bd710;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  this_00 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,logger);
  }
  asmjit::X86Assembler::X86Assembler(&local_1f8,this_00);
  emit_parser_prolog(&local_1f8);
  MyConstPool::MyConstPool(&local_140,&local_1f8);
  local_208._packed[0] = (UInt64)&DAT_00000032;
  local_208._any.reserved12_4 = 4;
  local_208._any.reserved8_4 = 0x20;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&local_1f8,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)&local_208._any);
  asmjit::Assembler::newLabel((Assembler *)&local_208._any);
  emit(&local_1f8,(Label *)&local_208._any,dfa,&local_140);
  emit_parser_epilog(&local_1f8,(Label *)&local_208._any);
  (*((local_140.m_as)->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[0xd])
            (local_140.m_as,&local_140.m_label,&local_140.m_pool);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&local_1f8);
  asmjit::ConstPool::~ConstPool(&local_140.m_pool);
  asmjit::Zone::~Zone(&local_140.m_zone);
  asmjit::X86Assembler::~X86Assembler(&local_1f8);
  return;
}

Assistant:

DFARoutineEM64T<TCHAR>::DFARoutineEM64T(const DFA<TCHAR>& dfa, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

	MyConstPool pool(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    asmjit::Label rejectlabel = as.newLabel();

    emit(as, rejectlabel, dfa, pool);

    emit_parser_epilog(as, rejectlabel);

	pool.embed();

    as.finalize();
}